

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

String * kj::getCaughtExceptionType(void)

{
  long lVar1;
  char *__ptr;
  size_t size;
  String *in_RDI;
  char *__s;
  int status;
  undefined1 local_3c [4];
  String local_38;
  
  lVar1 = __cxa_current_exception_type();
  __s = *(char **)(lVar1 + 8) + (**(char **)(lVar1 + 8) == '*');
  __ptr = (char *)__cxa_demangle(__s,0,0,local_3c);
  if (__ptr != (char *)0x0) {
    __s = __ptr;
  }
  size = strlen(__s);
  heapString(&local_38,__s,size);
  free(__ptr);
  (in_RDI->content).ptr = local_38.content.ptr;
  (in_RDI->content).size_ = local_38.content.size_;
  (in_RDI->content).disposer = local_38.content.disposer;
  return in_RDI;
}

Assistant:

kj::String getCaughtExceptionType() {
  return demangleTypeName(abi::__cxa_current_exception_type()->name());
}